

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmisc.c
# Opt level: O3

uint pseudo_gen_alloc(PseudoGenerator *generator,_Bool top)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if ((int)CONCAT71(in_register_00000031,top) == 0) {
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar1 = generator->bits[uVar6];
      if (uVar1 == 0xffffffffffffffff) {
        uVar3 = (ulong)((int)uVar3 + 0x40);
        bVar8 = true;
      }
      else {
        uVar5 = 0;
        do {
          uVar7 = 1L << ((byte)uVar5 & 0x3f);
          bVar8 = (uVar7 & uVar1) != 0;
          uVar3 = (ulong)((uint)bVar8 + (int)uVar3);
          if ((uVar7 & uVar1) == 0) break;
          bVar9 = uVar5 < 0x3f;
          uVar5 = uVar5 + 1;
        } while (bVar9);
      }
    } while ((bVar8) && (bVar8 = uVar6 < 3, uVar6 = uVar6 + 1, bVar8));
  }
  else {
    uVar4 = 3;
    iVar2 = -0xc0;
    do {
      if (generator->bits[uVar4] != 0) {
        uVar3 = (ulong)(uint)-iVar2;
        uVar6 = generator->bits[uVar4];
        do {
          uVar3 = (ulong)((int)uVar3 + 1);
          bVar8 = 1 < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar8);
        goto LAB_0010222d;
      }
      iVar2 = iVar2 + 0x40;
      bVar8 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar8);
    uVar3 = 0;
  }
LAB_0010222d:
  uVar4 = (uint)uVar3;
  generator->bits[uVar3 >> 6] = generator->bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
  if (generator->max_reg < uVar4) {
    __assert_fail("reg <= generator->max_reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/tests/tmisc.c"
                  ,0x12e,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
  }
  if (uVar4 == generator->max_reg) {
    generator->max_reg = uVar4 + 1;
  }
  return uVar4;
}

Assistant:

static unsigned pseudo_gen_alloc(PseudoGenerator *generator, bool top)
{
	unsigned reg;
	if (top) {
		int current_top = top_reg(generator);
		reg = current_top + 1;
	} else {
		/* look for the first free reg */
		reg = 0;
		int is_set = 1;
		for (int i = 0; is_set && i < N_WORDS; i++) {
			uint64_t bit = generator->bits[i];
			if (bit == ~0ull) {
				/* all bits set? skip */ 
				reg += ESIZE;
				continue;
			} 
			for (int j = 0; is_set && j < ESIZE; j++) {
				is_set = (bit & (1ull << j)) != 0;
				if (is_set)
					reg++;
			}
		}
	}
	unsigned i = reg / ESIZE;
	unsigned j = reg % ESIZE;
	generator->bits[i] |= (1ull << j);
	assert(reg <= generator->max_reg);
	if (reg == generator->max_reg)
		generator->max_reg += 1;
	return reg;
}